

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

size_t vkt::api::anon_unknown_1::getCurrentSystemMemoryUsage
                 (AllocationCallbackRecorder *allocRecoder)

{
  pointer pAVar1;
  size_t sVar2;
  TestError *this;
  AllocationCallbackValidationResults validationResults;
  AllocationCallbackValidationResults local_70;
  
  ::vk::AllocationCallbackValidationResults::AllocationCallbackValidationResults(&local_70);
  ::vk::validateAllocationCallbacks(allocRecoder,&local_70);
  if (local_70.violations.
      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_70.violations.
      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar2 = ::vk::getLiveSystemAllocationTotal(&local_70);
    pAVar1 = local_70.liveAllocations.
             super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_70.violations.
        super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.violations.
                      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.violations.
                            super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.violations.
                            super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.liveAllocations.
        super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.liveAllocations.
                      super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.liveAllocations.
                            super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.liveAllocations.
                            super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return ((ulong)((long)local_70.liveAllocations.
                          super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 4) *
           -0x5555555555555550 + sVar2;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"validationResults.violations.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
             ,0x14b);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

size_t getCurrentSystemMemoryUsage (const AllocationCallbackRecorder& allocRecoder)
{
	const size_t						systemAllocationOverhead	= sizeof(void*)*2;
	AllocationCallbackValidationResults	validationResults;

	validateAllocationCallbacks(allocRecoder, &validationResults);
	TCU_CHECK(validationResults.violations.empty());

	return getLiveSystemAllocationTotal(validationResults) + systemAllocationOverhead*validationResults.liveAllocations.size();
}